

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

int createEventfd(void)

{
  LogStream *this;
  Logger local_fe8;
  int local_c;
  int evtfd;
  
  local_c = eventfd(0,0x80800);
  if (local_c < 0) {
    Logger::Logger(&local_fe8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0xd);
    this = Logger::stream(&local_fe8);
    LogStream::operator<<(this,"Error: Failed in eventfd");
    Logger::~Logger(&local_fe8);
    abort();
  }
  return local_c;
}

Assistant:

int createEventfd() {
    int evtfd = eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC);
    if (evtfd < 0) {
        LOG << "Error: Failed in eventfd";
        abort();
    }

    return evtfd;
}